

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O3

bool Fossilize::create_low_priority_autogroup(void)

{
  char cVar1;
  __pid_t _Var2;
  __pid_t _Var3;
  ulong in_RAX;
  FILE *pFVar4;
  size_t sVar5;
  char buffer [2];
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  _Var2 = setsid();
  if (_Var2 < 0) {
    create_low_priority_autogroup();
  }
  else {
    _Var3 = getpgrp();
    if (_Var2 == _Var3) {
      _Var2 = getpgrp();
      _Var3 = getpid();
      if (_Var2 == _Var3) {
        pFVar4 = fopen("/proc/sys/kernel/sched_autogroup_enabled","rb");
        if (pFVar4 != (FILE *)0x0) {
          uStack_28 = uStack_28 & 0xffffffffffff;
          sVar5 = fread((void *)((long)&uStack_28 + 6),1,2,pFVar4);
          cVar1 = uStack_28._6_1_;
          fclose(pFVar4);
          if ((sVar5 != 0) && (cVar1 == '1')) {
            pFVar4 = fopen("/proc/self/autogroup","w");
            if (pFVar4 == (FILE *)0x0) {
              create_low_priority_autogroup();
              return true;
            }
            create_low_priority_autogroup();
            return true;
          }
        }
        create_low_priority_autogroup();
        return true;
      }
    }
    create_low_priority_autogroup();
  }
  return false;
}

Assistant:

static bool create_low_priority_autogroup()
{
	pid_t group_pid;

	// Set the process group ID so we can kill all the child processes as needed.
	// Use a new session ID so that we get a new scheduling autogroup.
	// This will also create a new process group.
	if ((group_pid = setsid()) < 0)
	{
		LOGE("Failed to set PGID in child.\n");
		return false;
	}

	// Sanity check that setsid did what we expected.
	if (group_pid != getpgrp() || getpgrp() != getpid())
	{
		LOGE("Failed to validate PGID in child.\n");
		return false;
	}

#ifdef __linux__
	bool autogroups_enabled = false;
	{
		FILE *file = fopen("/proc/sys/kernel/sched_autogroup_enabled", "rb");
		if (file)
		{
			char buffer[2] = {};
			if (fread(buffer, 1, sizeof(buffer), file) >= 1)
				autogroups_enabled = buffer[0] == '1';
			fclose(file);
		}

		// If the kernel does not enable autogroup scheduling support, don't bother.
	}

	if (autogroups_enabled)
	{
		// There is no API for setting the autogroup scheduling, so do it here.
		// Reference: https://github.com/nlburgin/reallynice
		FILE *file = fopen("/proc/self/autogroup", "w");
		if (file)
		{
			LOGI("Setting autogroup scheduling.\n");
			fputs("19", file);
			fclose(file);
		}
		else
			LOGE("/proc/self/autogroup does not exist on this system. Skipping autogrouping.\n");
	}
	else
		LOGI("Autogroup scheduling is not enabled on this kernel. Will rely entirely on nice().\n");
#endif

	return true;
}